

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O3

void __thiscall so_5::environment_params_t::~environment_params_t(environment_params_t *this)

{
  queue_params_t *pqVar1;
  _Manager_type p_Var2;
  queue_locks_defaults_manager_t *pqVar3;
  tracer_t *ptVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  event_exception_logger_t *peVar5;
  coop_listener_t *pcVar6;
  
  p_Var2 = (this->m_infrastructure_factory).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_infrastructure_factory,
              (_Any_data *)&this->m_infrastructure_factory,__destroy_functor);
  }
  pqVar3 = (this->m_queue_locks_defaults_manager)._M_t.
           super___uniq_ptr_impl<so_5::queue_locks_defaults_manager_t,_std::default_delete<so_5::queue_locks_defaults_manager_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::queue_locks_defaults_manager_t_*,_std::default_delete<so_5::queue_locks_defaults_manager_t>_>
           .super__Head_base<0UL,_so_5::queue_locks_defaults_manager_t_*,_false>._M_head_impl;
  if (pqVar3 != (queue_locks_defaults_manager_t *)0x0) {
    (*pqVar3->_vptr_queue_locks_defaults_manager_t[1])();
  }
  (this->m_queue_locks_defaults_manager)._M_t.
  super___uniq_ptr_impl<so_5::queue_locks_defaults_manager_t,_std::default_delete<so_5::queue_locks_defaults_manager_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::queue_locks_defaults_manager_t_*,_std::default_delete<so_5::queue_locks_defaults_manager_t>_>
  .super__Head_base<0UL,_so_5::queue_locks_defaults_manager_t_*,_false>._M_head_impl =
       (queue_locks_defaults_manager_t *)0x0;
  p_Var2 = (this->m_default_disp_params).m_queue_params.m_lock_factory.super__Function_base.
           _M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    pqVar1 = &(this->m_default_disp_params).m_queue_params;
    (*p_Var2)((_Any_data *)pqVar1,(_Any_data *)pqVar1,__destroy_functor);
  }
  ptVar4 = (this->m_message_delivery_tracer)._M_t.
           super___uniq_ptr_impl<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::msg_tracing::tracer_t_*,_std::default_delete<so_5::msg_tracing::tracer_t>_>
           .super__Head_base<0UL,_so_5::msg_tracing::tracer_t_*,_false>._M_head_impl;
  if (ptVar4 != (tracer_t *)0x0) {
    (*ptVar4->_vptr_tracer_t[1])();
  }
  (this->m_message_delivery_tracer)._M_t.
  super___uniq_ptr_impl<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::msg_tracing::tracer_t_*,_std::default_delete<so_5::msg_tracing::tracer_t>_>
  .super__Head_base<0UL,_so_5::msg_tracing::tracer_t_*,_false>._M_head_impl = (tracer_t *)0x0;
  this_00 = (this->m_error_logger).
            super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  peVar5 = (this->m_event_exception_logger)._M_t.
           super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
           .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl;
  if (peVar5 != (event_exception_logger_t *)0x0) {
    (*peVar5->_vptr_event_exception_logger_t[1])();
  }
  (this->m_event_exception_logger)._M_t.
  super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
  .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl =
       (event_exception_logger_t *)0x0;
  pcVar6 = (this->m_coop_listener)._M_t.
           super___uniq_ptr_impl<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::coop_listener_t_*,_std::default_delete<so_5::coop_listener_t>_>
           .super__Head_base<0UL,_so_5::coop_listener_t_*,_false>._M_head_impl;
  if (pcVar6 != (coop_listener_t *)0x0) {
    (*pcVar6->_vptr_coop_listener_t[1])();
  }
  (this->m_coop_listener)._M_t.
  super___uniq_ptr_impl<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>._M_t.
  super__Tuple_impl<0UL,_so_5::coop_listener_t_*,_std::default_delete<so_5::coop_listener_t>_>.
  super__Head_base<0UL,_so_5::coop_listener_t_*,_false>._M_head_impl = (coop_listener_t *)0x0;
  std::
  _Rb_tree<std::type_index,_std::pair<const_std::type_index,_std::shared_ptr<so_5::layer_t>_>,_std::_Select1st<std::pair<const_std::type_index,_std::shared_ptr<so_5::layer_t>_>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<so_5::layer_t>_>_>_>
  ::~_Rb_tree(&(this->m_so_layers)._M_t);
  p_Var2 = (this->m_timer_thread_factory).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_timer_thread_factory,(_Any_data *)&this->m_timer_thread_factory,
              __destroy_functor);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
               *)this);
  return;
}

Assistant:

environment_params_t::~environment_params_t()
{
}